

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_test.cpp
# Opt level: O1

int PMPML_TestSpeedAlt_64_out_32(void *key,int len,int iter)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  ULARGE_INTEGER__XX constTerm;
  uint64_t ctr;
  undefined8 local_50;
  uint local_48;
  
  if (iter < 1) {
    iVar16 = 0;
  }
  else {
    uVar17 = len & 3;
    iVar16 = 0;
    do {
      if (0x1f < (uint)len) {
        if ((uint)len < 0x200) {
          uVar1 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThanChunk
                            (&pmpml_hasher_64_out_32,(uchar *)key,len);
        }
        else if ((uint)len < 0x1000) {
          uVar1 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
                            (&pmpml_hasher_64_out_32,(uchar *)key,len);
        }
        else {
          uVar1 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_type2
                            (&pmpml_hasher_64_out_32,(uchar *)key,len);
        }
        goto LAB_00182f1b;
      }
      local_50 = (pmpml_hasher_64_out_32.curr_rd)->const_term;
      local_48 = 0;
      switch((ulong)((uint)len >> 2)) {
      case 1:
        uVar2 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar2);
        local_50 = local_50 + uVar2;
        uVar1 = (uint)bVar18;
        local_48 = (uint)bVar18;
        uVar2 = 1;
        switch(uVar17) {
        case 0:
          goto switchD_00182d15_caseD_0;
        case 2:
          goto switchD_00182d15_caseD_2;
        case 3:
          goto switchD_00182d15_caseD_3;
        }
        goto switchD_00182d15_caseD_1;
      case 2:
        uVar2 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar2);
        uVar2 = local_50 + uVar2;
        uVar3 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        local_50 = uVar2 + uVar3;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar2,uVar3);
        uVar2 = 1;
        uVar1 = local_48;
        switch(uVar17) {
        case 1:
          goto switchD_00182d15_caseD_1;
        case 2:
          goto switchD_00182d15_caseD_2;
        case 3:
          goto switchD_00182d15_caseD_3;
        }
        break;
      case 3:
        uVar2 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar2);
        uVar2 = local_50 + uVar2;
        uVar3 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar5 = uVar2 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        local_50 = uVar5 + uVar4;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar2,uVar3) + (uint)CARRY8(uVar5,uVar4);
        uVar2 = 1;
        uVar1 = local_48;
        switch(uVar17) {
        case 1:
          goto switchD_00182d15_caseD_1;
        case 2:
          goto switchD_00182d15_caseD_2;
        case 3:
          goto switchD_00182d15_caseD_3;
        }
        break;
      case 4:
        uVar2 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar2);
        uVar2 = local_50 + uVar2;
        uVar3 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar6 = uVar2 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar7 = uVar6 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        local_50 = uVar7 + uVar5;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar2,uVar3) + (uint)CARRY8(uVar6,uVar4) +
                   (uint)CARRY8(uVar7,uVar5);
        uVar2 = 1;
        uVar1 = local_48;
        switch(uVar17) {
        case 1:
          goto switchD_00182d15_caseD_1;
        case 2:
          goto switchD_00182d15_caseD_2;
        case 3:
          goto switchD_00182d15_caseD_3;
        }
        break;
      case 5:
        uVar2 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar2);
        uVar2 = local_50 + uVar2;
        uVar3 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar7 = uVar2 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar8 = uVar7 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        uVar11 = uVar8 + uVar5;
        uVar6 = (ulong)*(uint *)((long)key + 0x10) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        local_50 = uVar11 + uVar6;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar2,uVar3) + (uint)CARRY8(uVar7,uVar4) +
                   (uint)CARRY8(uVar8,uVar5) + (uint)CARRY8(uVar11,uVar6);
        uVar2 = 1;
        uVar1 = local_48;
        switch(uVar17) {
        case 1:
          goto switchD_00182d15_caseD_1;
        case 2:
          goto switchD_00182d15_caseD_2;
        case 3:
          goto switchD_00182d15_caseD_3;
        }
        break;
      case 6:
        uVar2 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar2);
        uVar2 = local_50 + uVar2;
        uVar3 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar8 = uVar2 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar11 = uVar8 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        uVar12 = uVar11 + uVar5;
        uVar6 = (ulong)*(uint *)((long)key + 0x10) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        uVar13 = uVar12 + uVar6;
        uVar7 = (ulong)*(uint *)((long)key + 0x14) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
        local_50 = uVar13 + uVar7;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar2,uVar3) + (uint)CARRY8(uVar8,uVar4) +
                   (uint)CARRY8(uVar11,uVar5) + (uint)CARRY8(uVar12,uVar6) +
                   (uint)CARRY8(uVar13,uVar7);
        uVar2 = 1;
        uVar1 = local_48;
        switch(uVar17) {
        case 1:
          goto switchD_00182d15_caseD_1;
        case 2:
          goto switchD_00182d15_caseD_2;
        case 3:
          goto switchD_00182d15_caseD_3;
        }
        break;
      default:
        uVar2 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar2);
        uVar2 = local_50 + uVar2;
        uVar3 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar11 = uVar2 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar12 = uVar11 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        uVar13 = uVar12 + uVar5;
        uVar6 = (ulong)*(uint *)((long)key + 0x10) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        uVar14 = uVar13 + uVar6;
        uVar7 = (ulong)*(uint *)((long)key + 0x14) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
        uVar15 = uVar14 + uVar7;
        uVar8 = (ulong)*(uint *)((long)key + 0x18) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[6];
        local_50 = uVar15 + uVar8;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar2,uVar3) + (uint)CARRY8(uVar11,uVar4) +
                   (uint)CARRY8(uVar12,uVar5) + (uint)CARRY8(uVar13,uVar6) +
                   (uint)CARRY8(uVar14,uVar7) + (uint)CARRY8(uVar15,uVar8);
      case 0:
        uVar2 = 1;
        uVar1 = local_48;
        switch(uVar17) {
        case 1:
switchD_00182d15_caseD_1:
          local_48 = uVar1;
          uVar2 = (ulong)(*(byte *)((long)key + (ulong)(len - 1)) | 0x100);
          break;
        case 2:
switchD_00182d15_caseD_2:
          local_48 = uVar1;
          uVar2 = (ulong)(*(ushort *)((long)key + ((ulong)(uint)len - 2)) | 0x10000);
          break;
        case 3:
switchD_00182d15_caseD_3:
          local_48 = uVar1;
          uVar2 = (ulong)((uint)*(byte *)((long)key + (ulong)(len - 1)) * 0x10000 + 0x1000000 +
                         (uint)*(ushort *)((long)key + ((ulong)(uint)len - 3)));
        }
      }
switchD_00182d15_caseD_0:
      uVar2 = uVar2 * (pmpml_hasher_64_out_32.curr_rd)->random_coeff[(uint)len >> 2];
      uVar3 = local_50 + uVar2;
      local_48 = local_48 + CARRY8(local_50,uVar2);
      uVar2 = (uVar3 >> 0x20) * 0xf;
      uVar1 = local_48 * 0xe1 + 0xf + (int)(uVar2 >> 0x20) * 0xf;
      local_50._0_4_ = (uint)uVar3;
      local_50 = CONCAT44(CARRY4((uint)local_50,uVar1) + 1,(uint)local_50 + uVar1);
      lVar10 = local_50 - (uVar2 & 0xffffffff);
      local_50._4_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar9 = (uint)lVar10;
      if (uVar9 < 0x1e) {
        if (local_50._4_4_ == 0) goto LAB_00182f14;
        uVar1 = uVar9 + 0xf + local_50._4_4_ * -0xf;
        if (0xe < uVar1) goto LAB_00182f01;
      }
      else {
LAB_00182f01:
        uVar9 = local_50._4_4_ * -0xf + uVar9;
        uVar9 = uVar9 >> 0xd ^ uVar9;
LAB_00182f14:
        uVar1 = uVar9 * -0x54c41ab1 >> 0x10 ^ uVar9 * -0x54c41ab1;
      }
LAB_00182f1b:
      iVar16 = iVar16 + uVar1;
      iter = iter + -1;
    } while (iter != 0);
  }
  return iVar16;
}

Assistant:

int PMPML_TestSpeedAlt_64_out_32( const void * key, int len, int iter )
{
	int dummy = 0;
	for ( int i=0; i<iter; i++ )
	{
		dummy += pmpml_hasher_64_out_32.hash( (unsigned char*)key, len );
	}
	return dummy;
}